

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

void __thiscall llvm::sys::fs::detail::DirIterState::~DirIterState(DirIterState *this)

{
  DirIterState *this_local;
  
  directory_iterator_destruct(this);
  directory_entry::~directory_entry(&this->CurrentEntry);
  return;
}

Assistant:

~DirIterState() {
      directory_iterator_destruct(*this);
    }